

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBblif.c
# Opt level: O0

Abc_Ntk_t * Bbl_ManToAig(Bbl_Man_t *p)

{
  int iVar1;
  void *__ptr;
  char *pcVar2;
  Dec_Graph_t *pDVar3;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *p_00;
  Abc_Obj_t *pAVar4;
  Vec_Ptr_t *p_01;
  Vec_Ptr_t *p_02;
  Bbl_Obj_t *pBVar5;
  void *Entry;
  Abc_Obj_t *pObj_00;
  abctime clk;
  int i;
  Dec_Graph_t **pFForms;
  Vec_Ptr_t *vFaninAigs;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vCopy;
  Bbl_Obj_t *pFanin;
  Bbl_Obj_t *pObj;
  Abc_Obj_t *pObjNew;
  Abc_Ntk_t *pNtk;
  int fVerbose;
  Bbl_Man_t *p_local;
  
  Abc_Clock();
  iVar1 = Bbl_ManFncSize(p);
  __ptr = calloc((long)iVar1,8);
  for (pFanin = Bbl_ManObjFirst(p); pFanin != (Bbl_Obj_t *)0x0; pFanin = Bbl_ManObjNext(p,pFanin)) {
    iVar1 = Bbl_ObjFncHandle(pFanin);
    if (*(long *)((long)__ptr + (long)iVar1 * 8) == 0) {
      pcVar2 = Bbl_ObjSop(p,pFanin);
      pDVar3 = Dec_Factor(pcVar2);
      iVar1 = Bbl_ObjFncHandle(pFanin);
      *(Dec_Graph_t **)((long)__ptr + (long)iVar1 * 8) = pDVar3;
    }
  }
  pNtk_00 = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  pcVar2 = Bbl_ManName(p);
  pcVar2 = Extra_UtilStrsav(pcVar2);
  pNtk_00->pName = pcVar2;
  p_00 = Vec_PtrStart(1000);
  for (pFanin = Bbl_ManObjFirst(p); pFanin != (Bbl_Obj_t *)0x0; pFanin = Bbl_ManObjNext(p,pFanin)) {
    iVar1 = Bbl_ObjIsInput(pFanin);
    if (iVar1 != 0) {
      iVar1 = Bbl_ObjId(pFanin);
      pAVar4 = Abc_NtkCreatePi(pNtk_00);
      Vec_PtrSetEntry(p_00,iVar1,pAVar4);
    }
  }
  Abc_Clock();
  p_01 = Bbl_ManDfs(p);
  p_02 = Vec_PtrAlloc(100);
  for (clk._4_4_ = 0; iVar1 = Vec_PtrSize(p_01), clk._4_4_ < iVar1; clk._4_4_ = clk._4_4_ + 1) {
    pBVar5 = (Bbl_Obj_t *)Vec_PtrEntry(p_01,clk._4_4_);
    Vec_PtrClear(p_02);
    for (vCopy = (Vec_Ptr_t *)Bbl_ObjFaninFirst(pBVar5); vCopy != (Vec_Ptr_t *)0x0;
        vCopy = (Vec_Ptr_t *)Bbl_ObjFaninNext(pBVar5,(Bbl_Obj_t *)vCopy)) {
      iVar1 = Bbl_ObjId((Bbl_Obj_t *)vCopy);
      Entry = Vec_PtrEntry(p_00,iVar1);
      Vec_PtrPush(p_02,Entry);
    }
    iVar1 = Bbl_ObjFncHandle(pBVar5);
    pAVar4 = Dec_GraphToAig(pNtk_00,*(Dec_Graph_t **)((long)__ptr + (long)iVar1 * 8),p_02);
    iVar1 = Bbl_ObjId(pBVar5);
    Vec_PtrSetEntry(p_00,iVar1,pAVar4);
  }
  Vec_PtrFree(p_02);
  Vec_PtrFree(p_01);
  for (pFanin = Bbl_ManObjFirst(p); pFanin != (Bbl_Obj_t *)0x0; pFanin = Bbl_ManObjNext(p,pFanin)) {
    iVar1 = Bbl_ObjIsOutput(pFanin);
    if (iVar1 != 0) {
      pBVar5 = Bbl_ObjFaninFirst(pFanin);
      iVar1 = Bbl_ObjId(pBVar5);
      pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p_00,iVar1);
      pObj_00 = Abc_NtkCreatePo(pNtk_00);
      Abc_ObjAddFanin(pObj_00,pAVar4);
    }
  }
  Abc_AigCleanup((Abc_Aig_t *)pNtk_00->pManFunc);
  clk._4_4_ = Bbl_ManFncSize(p);
  while (clk._4_4_ = clk._4_4_ + -1, -1 < clk._4_4_) {
    if (*(long *)((long)__ptr + (long)clk._4_4_ * 8) != 0) {
      Dec_GraphFree(*(Dec_Graph_t **)((long)__ptr + (long)clk._4_4_ * 8));
    }
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  Abc_Clock();
  Vec_PtrFree(p_00);
  Abc_NtkAddDummyPiNames(pNtk_00);
  Abc_NtkAddDummyPoNames(pNtk_00);
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Bbl_ManToAig( Bbl_Man_t * p )
{
    extern int Bbl_ManFncSize( Bbl_Man_t * p );
    extern int Bbl_ObjFncHandle( Bbl_Obj_t * p );
    extern Abc_Obj_t * Dec_GraphToAig( Abc_Ntk_t * pNtk, Dec_Graph_t * pFForm, Vec_Ptr_t * vFaninAigs );
    int fVerbose = 0;
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pObjNew;
    Bbl_Obj_t * pObj, * pFanin;
    Vec_Ptr_t * vCopy, * vNodes, * vFaninAigs;
    Dec_Graph_t ** pFForms;
    int i;
    abctime clk;
clk = Abc_Clock();
    // map SOP handles into factored forms
    pFForms = ABC_CALLOC( Dec_Graph_t *, Bbl_ManFncSize(p) );
    Bbl_ManForEachObj( p, pObj )
        if ( pFForms[Bbl_ObjFncHandle(pObj)] == NULL )
            pFForms[Bbl_ObjFncHandle(pObj)] = Dec_Factor( Bbl_ObjSop(p, pObj) );
if ( fVerbose )
ABC_PRT( "Fct", Abc_Clock() - clk );
    // start the network
    pNtk = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pNtk->pName = Extra_UtilStrsav( Bbl_ManName(p) );
    vCopy = Vec_PtrStart( 1000 );
    // create CIs
    Bbl_ManForEachObj( p, pObj )
    {
        if ( !Bbl_ObjIsInput(pObj) )
            continue;
        Vec_PtrSetEntry( vCopy, Bbl_ObjId(pObj), Abc_NtkCreatePi(pNtk) );
    }
clk = Abc_Clock();
    // create internal nodes
    vNodes = Bbl_ManDfs( p );
    vFaninAigs = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Bbl_Obj_t *, vNodes, pObj, i )
    {
        // collect fanin AIGs
        Vec_PtrClear( vFaninAigs );
        Bbl_ObjForEachFanin( pObj, pFanin )
            Vec_PtrPush( vFaninAigs, Vec_PtrEntry( vCopy, Bbl_ObjId(pFanin) ) );
        // create the new node
        pObjNew = Dec_GraphToAig( pNtk, pFForms[Bbl_ObjFncHandle(pObj)], vFaninAigs );
        Vec_PtrSetEntry( vCopy, Bbl_ObjId(pObj), pObjNew );
    }
    Vec_PtrFree( vFaninAigs );
    Vec_PtrFree( vNodes );
if ( fVerbose )
ABC_PRT( "AIG", Abc_Clock() - clk );
    // create COs
    Bbl_ManForEachObj( p, pObj )
    {
        if ( !Bbl_ObjIsOutput(pObj) )
            continue;
        pObjNew = (Abc_Obj_t *)Vec_PtrEntry( vCopy, Bbl_ObjId(Bbl_ObjFaninFirst(pObj)) );
        Abc_ObjAddFanin( Abc_NtkCreatePo(pNtk), pObjNew );
    }
    Abc_AigCleanup( (Abc_Aig_t *)pNtk->pManFunc );
    // clear factored forms
    for ( i = Bbl_ManFncSize(p) - 1; i >= 0; i-- )
        if ( pFForms[i] )
            Dec_GraphFree( pFForms[i] );
    ABC_FREE( pFForms );
    // finalize
clk = Abc_Clock();
    Vec_PtrFree( vCopy );
    Abc_NtkAddDummyPiNames( pNtk );
    Abc_NtkAddDummyPoNames( pNtk );
if ( fVerbose )
ABC_PRT( "Nam", Abc_Clock() - clk );
//    if ( !Abc_NtkCheck( pNtk ) )
//        printf( "Bbl_ManToAig(): Network check has failed.\n" );
    return pNtk;
}